

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::OnAtomicStoreExpr(Validator *this,AtomicStoreExpr *expr)

{
  AtomicStoreExpr *expr_local;
  Validator *this_local;
  
  this->expr_loc_ = (Location *)&expr->field_0x18;
  (anonymous_namespace)::Validator::CheckAtomicExpr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
            ((Validator *)this,expr,0x16c6250);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::OnAtomicStoreExpr(AtomicStoreExpr* expr) {
  expr_loc_ = &expr->loc;
  CheckAtomicExpr(expr, &TypeChecker::OnAtomicStore);
  return Result::Ok;
}